

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::MergeFromString(Parser *this,string *input,Message *output)

{
  bool bVar1;
  void *in_RDI;
  ArrayInputStream input_stream;
  Message *in_stack_000000e8;
  ZeroCopyInputStream *in_stack_000000f0;
  Parser *in_stack_000000f8;
  ErrorCollector *in_stack_00000108;
  undefined1 in_stack_00000110 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  StringPiece *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  ArrayInputStream *in_stack_ffffffffffffffa0;
  undefined1 local_1;
  
  StringPiece::StringPiece<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = anon_unknown_19::CheckParseInputSize((StringPiece)in_stack_00000110,in_stack_00000108);
  if (bVar1) {
    std::__cxx11::string::data();
    std::__cxx11::string::size();
    io::ArrayInputStream::ArrayInputStream
              (in_stack_ffffffffffffffa0,in_RDI,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
    ;
    local_1 = Merge(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
    io::ArrayInputStream::~ArrayInputStream((ArrayInputStream *)0x432ea0);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TextFormat::Parser::MergeFromString(const std::string& input,
                                         Message* output) {
  DO(CheckParseInputSize(input, error_collector_));
  io::ArrayInputStream input_stream(input.data(), input.size());
  return Merge(&input_stream, output);
}